

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O0

void __thiscall CompilerStatistics::Finish(CompilerStatistics *this,char *keyName,uint timeMicros)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Timer *pTVar4;
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  InplaceStr key;
  uint timeMicros_local;
  char *keyName_local;
  CompilerStatistics *this_local;
  
  this->finishTime = timeMicros;
  key.end._4_4_ = timeMicros;
  InplaceStr::InplaceStr((InplaceStr *)local_30,keyName);
  local_34 = 0;
  while( true ) {
    uVar2 = SmallArray<CompilerStatistics::Timer,_16U>::size(&this->timers);
    if (uVar2 <= local_34) {
      __assert_fail("!\"unknown timer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Statistics.h"
                    ,0x39,"void CompilerStatistics::Finish(const char *, unsigned int)");
    }
    pTVar4 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&this->timers,local_34);
    bVar1 = InplaceStr::operator==(&pTVar4->keyName,(InplaceStr *)local_30);
    if (bVar1) break;
    local_34 = local_34 + 1;
  }
  iVar3 = key.end._4_4_ - this->startTime;
  pTVar4 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&this->timers,local_34);
  pTVar4->total = iVar3 + pTVar4->total;
  this->startTime = 0;
  return;
}

Assistant:

void Finish(const char *keyName, unsigned timeMicros)
	{
		finishTime = timeMicros;

		InplaceStr key = InplaceStr(keyName);

		for(unsigned i = 0; i < timers.size(); i++)
		{
			if(timers[i].keyName == key)
			{
				timers[i].total += timeMicros - startTime;

				startTime = 0;
				return;
			}
		}

		assert(!"unknown timer");
	}